

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O1

char * curl_easy_escape(Curl_easy *data,char *string,int inlength)

{
  CURLcode CVar1;
  size_t sVar2;
  char *pcVar3;
  size_t len;
  size_t sVar4;
  byte *mem;
  uchar in;
  char out [3];
  dynbuf d;
  byte local_55;
  byte local_54;
  char cStack_53;
  char local_52;
  dynbuf local_50;
  
  if (inlength < 0 || string == (char *)0x0) {
LAB_00126307:
    pcVar3 = (char *)0x0;
  }
  else {
    if (inlength == 0) {
      sVar2 = strlen(string);
    }
    else {
      sVar2 = (size_t)(uint)inlength;
    }
    if (sVar2 == 0) {
      pcVar3 = (*Curl_cstrdup)("");
      return pcVar3;
    }
    Curl_dyn_init(&local_50,sVar2 * 3 + 1);
    sVar4 = 0;
    do {
      local_55 = string[sVar4];
      if (((((byte)(local_55 - 0x30) < 10) || ((byte)((local_55 & 0xdf) + 0xbf) < 0x1a)) ||
          (local_55 - 0x2d < 2)) || ((local_55 == 0x7e || (local_55 == 0x5f)))) {
        len = 1;
        mem = &local_55;
      }
      else {
        _local_54 = CONCAT11("0123456789ABCDEF"[local_55 >> 4],0x25);
        local_52 = "0123456789ABCDEF"[local_55 & 0xf];
        len = 3;
        mem = &local_54;
      }
      CVar1 = Curl_dyn_addn(&local_50,mem,len);
      if (CVar1 != CURLE_OK) goto LAB_00126307;
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
    pcVar3 = Curl_dyn_ptr(&local_50);
  }
  return pcVar3;
}

Assistant:

char *curl_easy_escape(struct Curl_easy *data, const char *string,
                       int inlength)
{
  size_t length;
  struct dynbuf d;
  (void)data;

  if(!string || (inlength < 0))
    return NULL;

  length = (inlength ? (size_t)inlength : strlen(string));
  if(!length)
    return strdup("");

  Curl_dyn_init(&d, length * 3 + 1);

  while(length--) {
    /* treat the characters unsigned */
    unsigned char in = (unsigned char)*string++;

    if(ISUNRESERVED(in)) {
      /* append this */
      if(Curl_dyn_addn(&d, &in, 1))
        return NULL;
    }
    else {
      /* encode it */
      const char hex[] = "0123456789ABCDEF";
      char out[3]={'%'};
      out[1] = hex[in >> 4];
      out[2] = hex[in & 0xf];
      if(Curl_dyn_addn(&d, out, 3))
        return NULL;
    }
  }

  return Curl_dyn_ptr(&d);
}